

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptLayoutQualifierList(HlslGrammar *this,TQualifier *qualifier)

{
  HlslToken *pHVar1;
  bool bVar2;
  char cVar3;
  TIntermTyped *expr;
  HlslToken idToken;
  TIntermTyped *local_60;
  HlslToken local_58;
  
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLayout);
  if ((bVar2) &&
     (bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen), bVar2)
     ) {
    pHVar1 = &(this->super_HlslTokenStream).token;
    do {
      local_58.field_2.string = (TString *)0x0;
      local_58.loc.name = (TString *)0x0;
      local_58.loc.string = 0;
      local_58.loc.line = 0;
      local_58.loc.column = 0;
      bVar2 = acceptIdentifier(this,&local_58);
      cVar3 = '\x02';
      if (bVar2) {
        bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
        if (bVar2) {
          bVar2 = acceptConditionalExpression(this,&local_60);
          if (bVar2) {
            HlslParseContext::setLayoutQualifier
                      (this->parseContext,&local_58.loc,qualifier,local_58.field_2.string,local_60);
          }
          else {
            (*(this->parseContext->super_TParseContextBase).super_TParseVersions.
              _vptr_TParseVersions[0x2d])(this->parseContext,pHVar1,"Expected","expression","");
          }
          cVar3 = '\x01';
          if (!bVar2) goto LAB_0042dff4;
        }
        else {
          HlslParseContext::setLayoutQualifier
                    (this->parseContext,&local_58.loc,qualifier,local_58.field_2.string);
        }
        bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
        cVar3 = !bVar2 * '\x02';
      }
LAB_0042dff4:
    } while (cVar3 == '\0');
    if (cVar3 != '\x01') {
      bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
      if (bVar2) {
        return true;
      }
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2d])(this->parseContext,pHVar1,"Expected",")","");
      return false;
    }
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptLayoutQualifierList(TQualifier& qualifier)
{
    if (! acceptTokenClass(EHTokLayout))
        return false;

    // LEFT_PAREN
    if (! acceptTokenClass(EHTokLeftParen))
        return false;

    do {
        // identifier
        HlslToken idToken;
        if (! acceptIdentifier(idToken))
            break;

        // EQUAL expression
        if (acceptTokenClass(EHTokAssign)) {
            TIntermTyped* expr;
            if (! acceptConditionalExpression(expr)) {
                expected("expression");
                return false;
            }
            parseContext.setLayoutQualifier(idToken.loc, qualifier, *idToken.string, expr);
        } else
            parseContext.setLayoutQualifier(idToken.loc, qualifier, *idToken.string);

        // COMMA
        if (! acceptTokenClass(EHTokComma))
            break;
    } while (true);

    // RIGHT_PAREN
    if (! acceptTokenClass(EHTokRightParen)) {
        expected(")");
        return false;
    }

    return true;
}